

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  bool bVar2;
  int iVar3;
  int dir;
  uint inv;
  Table *h;
  
  inv = 0;
  do {
    h = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    if (h == (Table *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
      do {
        pTVar1 = (Table *)h->gclist;
        h->marked = h->marked | 0x20;
        iVar3 = traverseephemeron(g,h,inv);
        if (iVar3 != 0) {
          bVar2 = true;
          while (g->gray != (GCObject *)0x0) {
            propagatemark(g);
          }
        }
        h = pTVar1;
      } while (pTVar1 != (Table *)0x0);
      bVar2 = !bVar2;
    }
    inv = inv ^ 1;
  } while (!bVar2);
  return;
}

Assistant:

static void convergeephemerons (global_State *g) {
  int changed;
  int dir = 0;
  do {
    GCObject *w;
    GCObject *next = g->ephemeron;  /* get ephemeron list */
    g->ephemeron = NULL;  /* tables may return to this list when traversed */
    changed = 0;
    while ((w = next) != NULL) {  /* for each ephemeron table */
      Table *h = gco2t(w);
      next = h->gclist;  /* list is rebuilt during loop */
      nw2black(h);  /* out of the list (for now) */
      if (traverseephemeron(g, h, dir)) {  /* marked some value? */
        propagateall(g);  /* propagate changes */
        changed = 1;  /* will have to revisit all ephemeron tables */
      }
    }
    dir = !dir;  /* invert direction next time */
  } while (changed);  /* repeat until no more changes */
}